

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConverterRegistry.cpp
# Opt level: O0

ConverterFunction
SoapySDR::ConverterRegistry::getFunction
          (string *sourceFormat,string *targetFormat,FunctionPriority *priority)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type sVar3;
  size_type sVar4;
  runtime_error *this;
  mapped_type *pp_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  string local_1d8 [39];
  undefined1 local_1b1;
  string local_110 [39];
  undefined1 local_e9;
  string local_38 [56];
  
  lateLoadDefaultConverters();
  sVar1 = std::map<$5159af05$>::count
                    ((map<_5159af05_> *)
                     CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                     in_stack_fffffffffffffd78);
  if (sVar1 == 0) {
    local_e9 = 1;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x10);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   in_stack_fffffffffffffdb0);
    std::operator+(pbVar2,(char *)in_stack_fffffffffffffd70);
    std::operator+(pbVar2,in_stack_fffffffffffffd70);
    std::operator+(pbVar2,(char *)in_stack_fffffffffffffd70);
    std::__cxx11::to_string(in_stack_fffffffffffffdbc);
    std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    std::runtime_error::runtime_error((runtime_error *)pbVar2,local_38);
    local_e9 = 0;
    __cxa_throw(pbVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::map<$5159af05$>::operator[]
            ((map<_5159af05_> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                  in_stack_fffffffffffffd78);
  if (sVar3 == 0) {
    local_1b1 = 1;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x10);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   in_stack_fffffffffffffdb0);
    std::operator+(in_stack_fffffffffffffd78,(char *)pbVar2);
    std::operator+(in_stack_fffffffffffffd78,pbVar2);
    std::operator+(in_stack_fffffffffffffd78,(char *)pbVar2);
    std::__cxx11::to_string(in_stack_fffffffffffffdbc);
    std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    std::runtime_error::runtime_error((runtime_error *)pbVar2,local_110);
    local_1b1 = 0;
    __cxa_throw(pbVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::map<$5159af05$>::operator[]
            ((map<_5159af05_> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
                *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  sVar4 = std::
          map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
          ::count((map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
                   *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                  (key_type *)in_stack_fffffffffffffd78);
  if (sVar4 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   in_stack_fffffffffffffdb0);
    std::operator+(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
    std::operator+(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::operator+(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
    std::__cxx11::to_string(in_stack_fffffffffffffdbc);
    std::operator+(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    std::runtime_error::runtime_error(this,local_1d8);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::map<$5159af05$>::operator[]
            ((map<_5159af05_> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
                *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  pp_Var5 = std::
            map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
            ::operator[]((map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
                          *)in_stack_fffffffffffffdb0,(key_type *)in_stack_fffffffffffffda8);
  return (ConverterFunction)*pp_Var5;
}

Assistant:

SoapySDR::ConverterRegistry::ConverterFunction SoapySDR::ConverterRegistry::getFunction(const std::string &sourceFormat, const std::string &targetFormat, const FunctionPriority &priority)
{
  lateLoadDefaultConverters();

  if (formatConverters.count(sourceFormat) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion source not registered; "
                               "sourceFormat="+sourceFormat+", targetFormat="+targetFormat+", priority="+std::to_string(priority));
    }

  if (formatConverters[sourceFormat].count(targetFormat) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion target not registered; "
                               "sourceFormat="+sourceFormat+", targetFormat="+targetFormat+", priority="+std::to_string(priority));
    }

  if (formatConverters[sourceFormat][targetFormat].count(priority) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion priority not registered; "
                               "sourceFormat="+sourceFormat+", targetFormat="+targetFormat+", priority="+std::to_string(priority));
    }

  return formatConverters[sourceFormat][targetFormat][priority];
}